

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O3

void __thiscall
Catch::Capturer::captureValues<unsigned_long,char[3],char[5]>
          (Capturer *this,size_t index,unsigned_long *value,char (*values) [3],char (*values_1) [5])

{
  string local_48;
  
  StringMaker<unsigned_long,void>::convert_abi_cxx11_
            (&local_48,(StringMaker<unsigned_long,void> *)*value,(unsigned_long)value);
  captureValue(this,index,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  captureValues<char[3],char[5]>(this,index + 1,values,values_1);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }